

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline.h
# Opt level: O0

void __thiscall
cmdline::parser::option_with_value<int>::option_with_value
          (option_with_value<int> *this,string *name,char short_name,bool need,int *def,string *desc
          )

{
  byte in_CL;
  undefined1 in_DL;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  undefined4 *in_R8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_retaddr;
  string *in_stack_000000a0;
  option_with_value<int> *in_stack_000000a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  
  __str = in_RDI;
  option_base::option_base((option_base *)in_RDI);
  (in_RDI->_M_dataplus)._M_p = (pointer)&PTR__option_with_value_0020caf0;
  this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            &in_RDI->_M_string_length;
  std::__cxx11::string::string(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  *(undefined1 *)&in_RDI[1]._M_string_length = in_DL;
  *(byte *)((long)&in_RDI[1]._M_string_length + 1) = in_CL & 1;
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&in_RDI[1].field_2;
  std::__cxx11::string::string(this_01);
  in_RDI[2].field_2._M_local_buf[0] = '\0';
  *(undefined4 *)((long)&in_RDI[2].field_2 + 4) = *in_R8;
  *(undefined4 *)((long)&in_RDI[2].field_2 + 8) = *in_R8;
  full_description(in_stack_000000a8,in_stack_000000a0);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (unaff_retaddr,__str);
  std::__cxx11::string::~string(this_00);
  return;
}

Assistant:

option_with_value(const std::string &name, char short_name, bool need,
                      const T &def, const std::string &desc)
        : nam(name),
          snam(short_name),
          need(need),
          has(false),
          def(def),
          actual(def) {
      this->desc = full_description(desc);
    }